

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

GCtab * lj_tab_new(lua_State *L,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  uint64_t uVar2;
  GCtab *pGVar3;
  undefined8 *puVar4;
  GCtab *t;
  uint32_t hbits_local;
  uint32_t asize_local;
  lua_State *L_local;
  TValue *array;
  uint32_t asize_1;
  uint32_t i;
  Node *n;
  Node *node;
  uint32_t hmask;
  uint32_t i_1;
  
  pGVar3 = newtab(L,asize,hbits);
  uVar1 = pGVar3->asize;
  uVar2 = (pGVar3->array).ptr64;
  for (array._4_4_ = 0; array._4_4_ < uVar1; array._4_4_ = array._4_4_ + 1) {
    *(undefined8 *)(uVar2 + (ulong)array._4_4_ * 8) = 0xffffffffffffffff;
  }
  if (pGVar3->hmask != 0) {
    uVar1 = pGVar3->hmask;
    uVar2 = (pGVar3->node).ptr64;
    for (node._4_4_ = 0; node._4_4_ <= uVar1; node._4_4_ = node._4_4_ + 1) {
      puVar4 = (undefined8 *)(uVar2 + (ulong)node._4_4_ * 0x18);
      puVar4[2] = 0;
      puVar4[1] = 0xffffffffffffffff;
      *puVar4 = 0xffffffffffffffff;
    }
  }
  return pGVar3;
}

Assistant:

GCtab *lj_tab_new(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t = newtab(L, asize, hbits);
  clearapart(t);
  if (t->hmask > 0) clearhpart(t);
  return t;
}